

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O3

void pzshape::TPZShapePrism::ShapeGenerating
               (TPZVec<double> *pt,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  int node;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  TPZStack<int,_10> highsides;
  long local_80;
  TPZManVector<int,_10> local_78;
  
  lVar11 = 6;
  local_80 = 0x30;
  do {
    iVar7 = (int)lVar11;
    iVar6 = pztopology::TPZPrism::NSideNodes(iVar7);
    switch(iVar6) {
    case 2:
      iVar6 = pztopology::TPZPrism::SideNodeLocId(iVar7,0);
      node = 1;
      goto LAB_00fe0c41;
    case 3:
      lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = phi->fElem;
      if (lVar12 < 4) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 < 2) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 < 5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (ulong)(lVar11 == 0x13) * 3 + 2;
      if (lVar12 <= lVar9) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 <= lVar11) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5[lVar11] = (*pdVar5 + pdVar5[3]) * (pdVar5[1] + pdVar5[4]) * pdVar5[lVar9];
      lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar15 = 0;
      do {
        lVar14 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        if (lVar14 < 1 || lVar12 <= lVar15) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((lVar12 <= lVar15) || (lVar14 < 4)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar14 = lVar12 * 3;
        lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar12 < 2) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar5 = phi->fElem;
        if (lVar12 < 5) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar12 <= lVar9) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar12 < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar12 < 4) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        if (lVar12 < 2 || lVar1 <= lVar15) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((lVar1 <= lVar15) || (lVar12 < 5)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar12 <= lVar9) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        pdVar3 = phi->fElem;
        if (lVar12 < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar12 < 4) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar12 < 2) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar12 < 5) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        lVar2 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
        if (lVar2 <= lVar9 || lVar12 <= lVar15) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((lVar12 <= lVar15) || (lVar2 <= lVar11)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(double *)((long)dphi->fElem + lVar15 * 8 + local_80 * lVar12) =
             (*pdVar3 + pdVar3[3]) * (pdVar3[1] + pdVar3[4]) * dphi->fElem[lVar12 * lVar9 + lVar15]
             + (dphi->fElem[lVar15] + dphi->fElem[lVar14 + lVar15]) * (pdVar5[1] + pdVar5[4]) *
               pdVar5[lVar9] +
               (*pdVar5 + pdVar5[3]) *
               (dphi->fElem[lVar1 + lVar15] + dphi->fElem[lVar1 * 4 + lVar15]) * pdVar3[lVar9];
        lVar15 = lVar15 + 1;
      } while (lVar15 != 3);
      break;
    case 4:
      iVar6 = pztopology::TPZPrism::SideNodeLocId(iVar7,0);
      node = 2;
LAB_00fe0c41:
      iVar7 = pztopology::TPZPrism::SideNodeLocId(iVar7,node);
      lVar12 = (long)iVar6;
      if (((iVar6 < 0) ||
          (lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar9 <= lVar12)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = phi->fElem;
      lVar14 = (long)iVar7;
      if ((iVar7 < 0) || (lVar9 <= lVar14)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar9 <= lVar11) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5[lVar11] = pdVar5[lVar12] * pdVar5[lVar14];
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if (((lVar9 < 1) || (iVar6 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar7 < 0) ||
          (lVar15 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar15 <= lVar14)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar6 < 0) || (lVar15 <= lVar12)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar15 < 1) ||
         (lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
         iVar7 < 0 || lVar1 <= lVar14)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = dphi->fElem;
      if ((lVar15 < 1) || (lVar1 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5[lVar15 * lVar11] =
           dphi->fElem[lVar9 * lVar12] * phi->fElem[lVar14] +
           phi->fElem[lVar12] * pdVar5[lVar15 * lVar14];
      if (((lVar15 < 2) || (iVar6 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar7 < 0) ||
          (lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar9 <= lVar14)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar6 < 0) || (lVar9 <= lVar12)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar1 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar1 < 2) ||
         (lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
         iVar7 < 0 || lVar9 <= lVar14)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3 = dphi->fElem;
      if ((lVar1 < 2) || (lVar9 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3[lVar1 * lVar11 + 1] =
           pdVar5[lVar15 * lVar12 + 1] * phi->fElem[lVar14] +
           phi->fElem[lVar12] * pdVar3[lVar1 * lVar14 + 1];
      if (((lVar1 < 3) || (iVar6 < 0)) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar12)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar7 < 0) ||
          (lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar9 <= lVar14)) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((iVar6 < 0) || (lVar9 <= lVar12)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 3) ||
         (lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
         iVar7 < 0 || lVar15 <= lVar14)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar8 = dphi->fElem;
      dVar16 = pdVar3[lVar1 * lVar12 + 2] * phi->fElem[lVar14] +
               phi->fElem[lVar12] * pdVar8[lVar14 * lVar9 + 2];
LAB_00fe2593:
      if ((lVar9 < 3) || (lVar15 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar8[lVar9 * lVar11 + 2] = dVar16;
      break;
    case 6:
      lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 1) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = phi->fElem;
      if (lVar12 < 5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 < 6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 <= lVar11) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5[lVar11] = *pdVar5 * pdVar5[4] * (pdVar5[2] + pdVar5[5]);
      if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = phi->fElem;
      if (lVar12 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 < 6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3 = phi->fElem;
      if (lVar9 < 6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar9 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar9 < 5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar15 < 3 || lVar9 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar8 = dphi->fElem;
      if (lVar15 < 6 || lVar9 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar9 < 1) || (lVar15 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar8[lVar9 * lVar11] =
           *pdVar3 * pdVar3[4] * (pdVar8[lVar9 * 2] + pdVar8[lVar9 * 5]) +
           *pdVar5 * dphi->fElem[lVar12 * 4] * (pdVar3[2] + pdVar3[5]) +
           *dphi->fElem * pdVar5[4] * (pdVar5[2] + pdVar5[5]);
      if ((lVar9 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = phi->fElem;
      if (lVar12 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 < 6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3 = phi->fElem;
      if (lVar9 < 6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar9 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar9 < 5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar15 < 3 || lVar9 < 2) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4 = dphi->fElem;
      if (lVar15 < 6 || lVar9 < 2) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar9 < 2) || (lVar15 <= lVar11)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar4[lVar9 * lVar11 + 1] =
           *pdVar3 * pdVar3[4] * (pdVar4[lVar9 * 2 + 1] + pdVar4[lVar9 * 5 + 1]) +
           *pdVar5 * dphi->fElem[lVar12 * 4 + 1] * (pdVar3[2] + pdVar3[5]) +
           pdVar8[1] * pdVar5[4] * (pdVar5[2] + pdVar5[5]);
      if ((lVar9 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar12 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 5) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = phi->fElem;
      if (lVar12 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar12 < 6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar12 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 5)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      if ((lVar9 < 3) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar3 = phi->fElem;
      if (lVar9 < 6) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar9 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (lVar9 < 5) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
      lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar15 < 3 || lVar9 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar8 = dphi->fElem;
      if (lVar15 < 6 || lVar9 < 3) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      dVar16 = *pdVar3 * pdVar3[4] * (pdVar8[lVar9 * 2 + 2] + pdVar8[lVar9 * 5 + 2]) +
               *pdVar5 * dphi->fElem[lVar12 * 4 + 2] * (pdVar3[2] + pdVar3[5]) +
               pdVar4[2] * pdVar5[4] * (pdVar5[2] + pdVar5[5]);
      goto LAB_00fe2593;
    }
    lVar11 = lVar11 + 1;
    local_80 = local_80 + 8;
    if (lVar11 == 0x15) {
      lVar11 = 6;
      do {
        TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
        pztopology::TPZPrism::HigherDimensionSides((int)lVar11,(TPZStack<int,_10> *)&local_78);
        uVar13 = (uint)local_78.super_TPZVec<int>.fNElements;
        if (0 < (int)uVar13) {
          uVar10 = 0;
          do {
            iVar6 = local_78.super_TPZVec<int>.fStore[uVar10];
            iVar7 = pztopology::TPZPrism::NSideNodes(iVar6);
            if (iVar7 == 4) {
              lVar12 = (long)iVar6;
              if (((iVar6 < 0) ||
                  (lVar9 = (phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow, lVar9 <= lVar12)
                  ) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5 = phi->fElem;
              if (lVar9 <= lVar11) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5[lVar11] = pdVar5[lVar12] + pdVar5[lVar11];
              lVar9 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              if ((lVar9 < 1) ||
                 (lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
                 iVar6 < 0 || lVar15 <= lVar12)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5 = dphi->fElem;
              if ((lVar9 < 1) || (lVar15 <= lVar11)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5[lVar9 * lVar11] = pdVar5[lVar9 * lVar12] + pdVar5[lVar9 * lVar11];
              if ((lVar9 < 2) ||
                 (lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
                 iVar6 < 0 || lVar15 <= lVar12)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((lVar9 < 2) || (lVar15 <= lVar11)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5[lVar9 * lVar11 + 1] = pdVar5[lVar9 * lVar12 + 1] + pdVar5[lVar9 * lVar11 + 1];
              if ((lVar9 < 3) ||
                 (lVar15 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol,
                 iVar6 < 0 || lVar15 <= lVar12)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((lVar9 < 3) || (lVar15 <= lVar11)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pdVar5[lVar9 * lVar11 + 2] = pdVar5[lVar12 * lVar9 + 2] + pdVar5[lVar9 * lVar11 + 2];
            }
            uVar10 = uVar10 + 1;
          } while ((uVar13 & 0x7fffffff) != uVar10);
        }
        TPZManVector<int,_10>::~TPZManVector(&local_78);
        lVar11 = lVar11 + 1;
        if (lVar11 == 0x15) {
          lVar11 = 6;
          while( true ) {
            dVar16 = *(double *)(&DAT_015271a0 + lVar11 * 8);
            if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar11) ||
               ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[lVar11] = phi->fElem[lVar11] * dVar16;
            lVar12 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar12 < 1) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)
               ) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar5 = dphi->fElem;
            lVar9 = lVar12 * lVar11;
            pdVar5[lVar9] = pdVar5[lVar9] * dVar16;
            if ((lVar12 < 2) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)
               ) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar5[lVar9 + 1] = pdVar5[lVar9 + 1] * dVar16;
            if ((lVar12 < 3) || ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar11)
               ) break;
            pdVar5[lVar9 + 2] = dVar16 * pdVar5[lVar9 + 2];
            lVar11 = lVar11 + 1;
            if (lVar11 == 0x15) {
              return;
            }
          }
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
      } while( true );
    }
  } while( true );
}

Assistant:

void TPZShapePrism::ShapeGenerating(const TPZVec<REAL> &pt, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
	{
		int is;
		// 9 ribs
		for(is=6; is<NSides; is++)
		{
			int nsnodes = NSideNodes(is);
			switch(nsnodes)
			{
				case 2:
				{
					int is1 = SideNodeLocId(is,0);
					int is2 = SideNodeLocId(is,1);
					phi(is,0) = phi(is1,0)*phi(is2,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
				}
					break;
				case 3:
				{
					int is0 = 0;
					int is1 = 1;
					int is2 = 2;
					int is3 = 3;
					int is4 = 4;
					if(is == 19)
					{
						is2 = 5;
					}
					phi(is,0) = (phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*phi(is2,0);
					int d;
					for(d=0; d<3; d++)
					{
						dphi(d,is) = 
						(dphi(d,is0)+dphi(d,is3))*(phi(is1,0)+phi(is4,0))*phi(is2,0) +
						(phi(is0,0)+phi(is3,0))*(dphi(d,is1)+dphi(d,is4))*phi(is2,0) +
						(phi(is0,0)+phi(is3,0))*(phi(is1,0)+phi(is4,0))*dphi(d,is2);
					}
				}
					break;
				case 4:
				{
					int is1 = SideNodeLocId(is,0);
					int is2 = SideNodeLocId(is,2);
					phi(is,0) = phi(is1,0)*phi(is2,0);
					dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
					dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
					dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
				}
					break;
				case 6:
				{
					int is1 = 0;
					int is2 = 4;
					int is3 = 2;
					int is4 = 5;
					phi(is,0) = phi(is1,0)*phi(is2,0)*(phi(is3,0)+phi(is4,0));
					dphi(0,is) = dphi(0,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(0,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(0,is3)+dphi(0,is4));
					dphi(1,is) = dphi(1,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(1,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(1,is3)+dphi(1,is4));
					dphi(2,is) = dphi(2,is1)*phi(is2,0)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*dphi(2,is2)*(phi(is3,0)+phi(is4,0))+phi(is1,0)*phi(is2,0)*(dphi(2,is3)+dphi(2,is4));
				}
					break;
				default:
					;
			}
		}
		// Make the generating shape functions linear and unitary
		for(is=6; is<NSides; is++)
		{
			TPZStack<int> highsides;
			HigherDimensionSides(is,highsides);
			int h, nh = highsides.NElements();
			for(h=0; h<nh; h++)
			{
				int hs = highsides[h];
				if(NSideNodes(hs) != 4) continue;
				phi(is,0) += phi(hs,0);
				dphi(0,is) += dphi(0,hs);
				dphi(1,is) += dphi(1,hs);
				dphi(2,is) += dphi(2,hs);
			}
		}
		REAL mult[] = {1.,1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,4.,27.,16.,16.,16.,27.,8.};
		for(is=6;is<NSides; is++)
		{
			phi(is,0) *= mult[is];
			dphi(0,is) *= mult[is];
			dphi(1,is) *= mult[is];
			dphi(2,is) *= mult[is];
		}
		
	}